

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_qpromiseconnections.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int argc_local;
  tst_qpromiseconnections tc;
  QCoreApplication app;
  
  argc_local = argc;
  QCoreApplication::QCoreApplication(&app,&argc_local,argv,0x60204);
  QCoreApplication::setAttribute(AA_Use96Dpi,true);
  tst_qpromiseconnections::tst_qpromiseconnections(&tc);
  QTest::setMainSourcePath
            ("/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromiseconnections/tst_qpromiseconnections.cpp"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/build_O2/tests/auto/qtpromise/qpromiseconnections"
            );
  iVar1 = QTest::qExec(&tc.super_QObject,argc_local,argv);
  QObject::~QObject(&tc.super_QObject);
  QCoreApplication::~QCoreApplication(&app);
  return iVar1;
}

Assistant:

void tst_qpromiseconnections::connections()
{
    Object sender;

    QtPromise::QPromiseConnections connections;
    QCOMPARE(sender.hasConnections(), false);
    QCOMPARE(connections.count(), 0);

    connections << connect(&sender, &Object::noArgSignal, [=]() {});
    QCOMPARE(sender.hasConnections(), true);
    QCOMPARE(connections.count(), 1);

    connections << connect(&sender, &Object::twoArgsSignal, [=]() {});
    QCOMPARE(sender.hasConnections(), true);
    QCOMPARE(connections.count(), 2);

    connections.disconnect();
    QCOMPARE(sender.hasConnections(), false);
    QCOMPARE(connections.count(), 0);
}